

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O0

int ffcpdt(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  long lVar1;
  int *in_RDX;
  long in_RSI;
  long in_RDI;
  char buffer [2880];
  LONGLONG outdatastart;
  LONGLONG indataend;
  LONGLONG indatastart;
  long ii;
  long nb;
  int *in_stack_fffffffffffff478;
  LONGLONG *in_stack_fffffffffffff480;
  undefined4 in_stack_fffffffffffff488;
  int in_stack_fffffffffffff48c;
  LONGLONG *in_stack_fffffffffffff490;
  fitsfile *in_stack_fffffffffffff498;
  int *in_stack_fffffffffffff4c0;
  void *in_stack_fffffffffffff4c8;
  int *in_stack_fffffffffffff4d0;
  fitsfile *in_stack_fffffffffffff4d8;
  LONGLONG in_stack_fffffffffffff4e0;
  fitsfile *in_stack_fffffffffffff4e8;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined4 local_4;
  
  if (*in_RDX < 1) {
    if (in_RDI == in_RSI) {
      *in_RDX = 0x65;
      local_4 = 0x65;
    }
    else {
      ffghadll(in_stack_fffffffffffff498,in_stack_fffffffffffff490,
               (LONGLONG *)CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488),
               in_stack_fffffffffffff480,in_stack_fffffffffffff478);
      ffghadll(in_stack_fffffffffffff498,in_stack_fffffffffffff490,
               (LONGLONG *)CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488),
               in_stack_fffffffffffff480,in_stack_fffffffffffff478);
      lVar1 = (local_40 - local_38) / 0xb40;
      if (0 < lVar1) {
        if (*(long *)(in_RDI + 8) == *(long *)(in_RSI + 8)) {
          for (local_30 = 0; local_30 < lVar1; local_30 = local_30 + 1) {
            ffmbyt(in_stack_fffffffffffff498,(LONGLONG)in_stack_fffffffffffff490,
                   in_stack_fffffffffffff48c,(int *)in_stack_fffffffffffff480);
            ffgbyt(in_stack_fffffffffffff4d8,(LONGLONG)in_stack_fffffffffffff4d0,
                   in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0);
            ffmbyt(in_stack_fffffffffffff498,(LONGLONG)in_stack_fffffffffffff490,
                   in_stack_fffffffffffff48c,(int *)in_stack_fffffffffffff480);
            ffpbyt(in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,
                   in_stack_fffffffffffff4d0);
          }
        }
        else {
          ffmbyt(in_stack_fffffffffffff498,(LONGLONG)in_stack_fffffffffffff490,
                 in_stack_fffffffffffff48c,(int *)in_stack_fffffffffffff480);
          ffmbyt(in_stack_fffffffffffff498,(LONGLONG)in_stack_fffffffffffff490,
                 in_stack_fffffffffffff48c,(int *)in_stack_fffffffffffff480);
          for (local_30 = 0; local_30 < lVar1; local_30 = local_30 + 1) {
            ffgbyt(in_stack_fffffffffffff4d8,(LONGLONG)in_stack_fffffffffffff4d0,
                   in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0);
            ffpbyt(in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,
                   in_stack_fffffffffffff4d0);
          }
        }
      }
      local_4 = *in_RDX;
    }
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffcpdt(fitsfile *infptr,    /* I - FITS file pointer to input file  */
           fitsfile *outfptr,   /* I - FITS file pointer to output file */
           int *status)         /* IO - error status     */
{
/*
  copy the data unit from the CHDU of infptr to the CHDU of outfptr. 
  This will overwrite any data already in the outfptr CHDU.
*/
    long nb, ii;
    LONGLONG indatastart, indataend, outdatastart;
    char buffer[2880];

    if (*status > 0)
        return(*status);

    if (infptr == outfptr)
        return(*status = SAME_FILE);

    ffghadll(infptr,  NULL, &indatastart, &indataend, status);
    ffghadll(outfptr, NULL, &outdatastart, NULL, status);

    /* Calculate the number of blocks to be copied  */
    nb = (long) ((indataend - indatastart) / 2880);

    if (nb > 0)
    {
      if (infptr->Fptr == outfptr->Fptr)
      {
        /* copying between 2 HDUs in the SAME file */
        for (ii = 0; ii < nb; ii++)
        {
            ffmbyt(infptr,  indatastart,  REPORT_EOF, status);
            ffgbyt(infptr,  2880L, buffer, status); /* read input block */

            ffmbyt(outfptr, outdatastart, IGNORE_EOF, status);
            ffpbyt(outfptr, 2880L, buffer, status); /* write output block */

            indatastart  += 2880; /* move address */
            outdatastart += 2880; /* move address */
        }
      }
      else
      {
        /* copying between HDUs in separate files */
        /* move to the initial copy position in each of the files */
        ffmbyt(infptr,  indatastart,  REPORT_EOF, status);
        ffmbyt(outfptr, outdatastart, IGNORE_EOF, status);

        for (ii = 0; ii < nb; ii++)
        {
            ffgbyt(infptr,  2880L, buffer, status); /* read input block */
            ffpbyt(outfptr, 2880L, buffer, status); /* write output block */
        }
      }
    }
    return(*status);
}